

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minicrypto.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 uStack_19c;
  long local_198;
  size_t i_5;
  undefined4 uStack_184;
  long local_180;
  size_t i_4;
  undefined4 uStack_16c;
  long local_168;
  size_t i_3;
  undefined4 uStack_154;
  long local_150;
  size_t i_2;
  undefined4 uStack_13c;
  long local_138;
  size_t i_1;
  undefined4 uStack_124;
  long local_120;
  size_t i;
  ptls_context_t ctxbuf;
  undefined1 local_50 [8];
  ptls_minicrypto_secp256r1sha256_sign_certificate_t sign_certificate;
  ptls_iovec_t cert;
  char **argv_local;
  int argc_local;
  
  subtest("secp256r1",test_secp256r1_key_exchange);
  subtest("x25519",test_x25519_key_exchange);
  subtest("secp256r1-sign",test_secp256r1_sign);
  join_0x00000010_0x00000000_ = ptls_iovec_init(anon_var_dwarf_1160b,0x264);
  join_0x00000010_0x00000000_ = ptls_iovec_init(anon_var_dwarf_11622,0x20);
  ptls_minicrypto_init_secp256r1sha256_sign_certificate
            ((ptls_minicrypto_secp256r1sha256_sign_certificate_t *)local_50,
             join_0x00000010_0x00000000_);
  i = (size_t)ptls_minicrypto_random_bytes;
  ctxbuf.random_bytes = (_func_void_void_ptr_size_t *)&ptls_get_time;
  ctxbuf.get_time = (ptls_get_time_t *)ptls_minicrypto_key_exchanges;
  ctxbuf.key_exchanges = (ptls_key_exchange_algorithm_t **)ptls_minicrypto_cipher_suites;
  ctxbuf.cipher_suites = (ptls_cipher_suite_t **)(sign_certificate.key + 0x18);
  ctxbuf.certificates.list = (ptls_iovec_t *)0x1;
  ctxbuf.certificates.count = 0;
  ctxbuf.esni = (ptls_esni_context_t **)0x0;
  ctxbuf.on_client_hello = (ptls_on_client_hello_t *)0x0;
  ctxbuf.emit_certificate = (ptls_emit_certificate_t *)local_50;
  ctxbuf.sign_certificate = (ptls_sign_certificate_t *)0x0;
  ctxbuf.verify_certificate._0_4_ = 0;
  ctxbuf.verify_certificate._4_4_ = 0;
  ctxbuf.ticket_lifetime = 0;
  ctxbuf.max_early_data_size = 0;
  ctxbuf.max_buffer_size = 0;
  ctxbuf.hkdf_label_prefix__obsolete._0_1_ = (byte)ctxbuf.hkdf_label_prefix__obsolete & 0xe0;
  ctxbuf._112_8_ = 0;
  ctxbuf.encrypt_ticket = (ptls_encrypt_ticket_t *)0x0;
  ctxbuf.save_ticket = (ptls_save_ticket_t *)0x0;
  ctxbuf.log_event = (ptls_log_event_t *)0x0;
  ctxbuf.update_open_count = (ptls_update_open_count_t *)0x0;
  ctxbuf.update_traffic_key = (ptls_update_traffic_key_t *)0x0;
  ctxbuf.decompress_certificate = (ptls_decompress_certificate_t *)0x0;
  ctxbuf.update_esni_key = (ptls_update_esni_key_t *)0x0;
  ctx_peer = (ptls_context_t *)&i;
  ctx = (ptls_context_t *)&i;
  for (local_120 = 0; ffx_variants[local_120].algo != (ptls_cipher_algorithm_t *)0x0;
      local_120 = local_120 + 1) {
  }
  ffx_variants[local_120].algo = &ptls_ffx_ptls_minicrypto_aes128ctr_b125_r8;
  *(ulong *)&ffx_variants[local_120].bit_length = CONCAT44(uStack_124,0x7d);
  for (local_138 = 0; ffx_variants[local_138].algo != (ptls_cipher_algorithm_t *)0x0;
      local_138 = local_138 + 1) {
  }
  ffx_variants[local_138].algo = &ptls_ffx_ptls_minicrypto_aes128ctr_b31_r6;
  *(ulong *)&ffx_variants[local_138].bit_length = CONCAT44(uStack_13c,0x1f);
  for (local_150 = 0; ffx_variants[local_150].algo != (ptls_cipher_algorithm_t *)0x0;
      local_150 = local_150 + 1) {
  }
  ffx_variants[local_150].algo = &ptls_ffx_ptls_minicrypto_aes128ctr_b53_r4;
  *(ulong *)&ffx_variants[local_150].bit_length = CONCAT44(uStack_154,0x35);
  for (local_168 = 0; ffx_variants[local_168].algo != (ptls_cipher_algorithm_t *)0x0;
      local_168 = local_168 + 1) {
  }
  ffx_variants[local_168].algo = &ptls_ffx_ptls_minicrypto_chacha20_b256_r8;
  *(ulong *)&ffx_variants[local_168].bit_length = CONCAT44(uStack_16c,0x100);
  for (local_180 = 0; ffx_variants[local_180].algo != (ptls_cipher_algorithm_t *)0x0;
      local_180 = local_180 + 1) {
  }
  ffx_variants[local_180].algo = &ptls_ffx_ptls_minicrypto_chacha20_b32_r6;
  *(ulong *)&ffx_variants[local_180].bit_length = CONCAT44(uStack_184,0x20);
  for (local_198 = 0; ffx_variants[local_198].algo != (ptls_cipher_algorithm_t *)0x0;
      local_198 = local_198 + 1) {
  }
  ffx_variants[local_198].algo = &ptls_ffx_ptls_minicrypto_chacha20_b57_r4;
  *(ulong *)&ffx_variants[local_198].bit_length = CONCAT44(uStack_19c,0x39);
  subtest("picotls",test_picotls);
  subtest("hrr",test_hrr);
  iVar1 = done_testing();
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    subtest("secp256r1", test_secp256r1_key_exchange);
    subtest("x25519", test_x25519_key_exchange);
    subtest("secp256r1-sign", test_secp256r1_sign);

    ptls_iovec_t cert = ptls_iovec_init(SECP256R1_CERTIFICATE, sizeof(SECP256R1_CERTIFICATE) - 1);

    ptls_minicrypto_secp256r1sha256_sign_certificate_t sign_certificate;
    ptls_minicrypto_init_secp256r1sha256_sign_certificate(&sign_certificate,
                                                          ptls_iovec_init(SECP256R1_PRIVATE_KEY, SECP256R1_PRIVATE_KEY_SIZE));

    ptls_context_t ctxbuf = {ptls_minicrypto_random_bytes,
                             &ptls_get_time,
                             ptls_minicrypto_key_exchanges,
                             ptls_minicrypto_cipher_suites,
                             {&cert, 1},
                             NULL,
                             NULL,
                             NULL,
                             &sign_certificate.super};
    ctx = ctx_peer = &ctxbuf;
    ADD_FFX_AES128_ALGORITHMS(minicrypto);
    ADD_FFX_CHACHA20_ALGORITHMS(minicrypto);

    subtest("picotls", test_picotls);
    subtest("hrr", test_hrr);

    return done_testing();
}